

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

void do_reduce(DisasContext_conflict1 *s,arg_rpr_esz *a,gen_helper_fp_reduce *fn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  uint oprsz;
  uint32_t val;
  int iVar1;
  uint64_t uVar2;
  TCGv_i32 arg;
  TCGv_i64 v;
  TCGv_ptr r;
  TCGv_ptr r_00;
  TCGv_ptr pTVar3;
  TCGv_i64 temp;
  TCGv_ptr status;
  TCGv_ptr t_pg;
  TCGv_ptr t_zn;
  TCGv_i32 t_desc;
  uint p2vsz;
  uint vsz;
  TCGContext_conflict1 *tcg_ctx;
  gen_helper_fp_reduce *fn_local;
  arg_rpr_esz *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  oprsz = vec_full_reg_size(s);
  uVar2 = pow2ceil((ulong)oprsz);
  val = simd_desc_aarch64(oprsz,(uint32_t)uVar2,0);
  arg = tcg_const_i32_aarch64(tcg_ctx_00,val);
  v = tcg_temp_new_i64(tcg_ctx_00);
  r = tcg_temp_new_ptr(tcg_ctx_00);
  r_00 = tcg_temp_new_ptr(tcg_ctx_00);
  pTVar3 = tcg_ctx_00->cpu_env;
  iVar1 = vec_full_reg_offset(s,a->rn);
  tcg_gen_addi_ptr(tcg_ctx_00,r,pTVar3,(long)iVar1);
  pTVar3 = tcg_ctx_00->cpu_env;
  iVar1 = pred_full_reg_offset(s,a->pg);
  tcg_gen_addi_ptr(tcg_ctx_00,r_00,pTVar3,(long)iVar1);
  pTVar3 = get_fpstatus_ptr_aarch64(tcg_ctx_00,a->esz == 1);
  (*fn)(tcg_ctx_00,v,r,r_00,pTVar3,arg);
  tcg_temp_free_ptr(tcg_ctx_00,r);
  tcg_temp_free_ptr(tcg_ctx_00,r_00);
  tcg_temp_free_ptr(tcg_ctx_00,pTVar3);
  tcg_temp_free_i32(tcg_ctx_00,arg);
  write_fp_dreg_aarch64(s,a->rd,v);
  tcg_temp_free_i64(tcg_ctx_00,v);
  return;
}

Assistant:

static void do_reduce(DisasContext *s, arg_rpr_esz *a,
                      gen_helper_fp_reduce *fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    unsigned vsz = vec_full_reg_size(s);
    unsigned p2vsz = pow2ceil(vsz);
    TCGv_i32 t_desc = tcg_const_i32(tcg_ctx, simd_desc(vsz, p2vsz, 0));
    TCGv_ptr t_zn, t_pg, status;
    TCGv_i64 temp;

    temp = tcg_temp_new_i64(tcg_ctx);
    t_zn = tcg_temp_new_ptr(tcg_ctx);
    t_pg = tcg_temp_new_ptr(tcg_ctx);

    tcg_gen_addi_ptr(tcg_ctx, t_zn, tcg_ctx->cpu_env, vec_full_reg_offset(s, a->rn));
    tcg_gen_addi_ptr(tcg_ctx, t_pg, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->pg));
    status = get_fpstatus_ptr(tcg_ctx, a->esz == MO_16);

    fn(tcg_ctx, temp, t_zn, t_pg, status, t_desc);
    tcg_temp_free_ptr(tcg_ctx, t_zn);
    tcg_temp_free_ptr(tcg_ctx, t_pg);
    tcg_temp_free_ptr(tcg_ctx, status);
    tcg_temp_free_i32(tcg_ctx, t_desc);

    write_fp_dreg(s, a->rd, temp);
    tcg_temp_free_i64(tcg_ctx, temp);
}